

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,v10 *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  size_t sVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  undefined1 local_109;
  char *local_108;
  size_t local_100;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  bool formattable_1;
  bool formattable_pointer_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f0;
  bool formattable_char_1;
  char *local_e8 [3];
  undefined1 local_c9;
  char *local_c8;
  size_t local_c0;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_b0;
  bool formattable_char;
  char *local_a8 [6];
  v10 *local_78;
  undefined1 *local_70;
  basic_string_view<char> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined1 *local_50;
  basic_string_view<char> local_48;
  char **local_38;
  basic_string_view<char> local_30;
  char **local_20;
  basic_string_view<char> local_18;
  
  local_b1 = 1;
  local_b2 = 1;
  local_b3 = 1;
  local_70 = &local_c9;
  pvStack_b0 = this;
  local_78 = this;
  local_68 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_c8 = local_68.data_;
  local_c0 = local_68.size_;
  local_30.data_ = local_68.data_;
  local_30.size_ = local_68.size_;
  local_38 = local_a8;
  local_a8[0] = basic_string_view<char>::data(&local_30);
  sVar1 = basic_string_view<char>::size(&local_30);
  local_f1 = 1;
  local_f2 = 1;
  local_f3 = 1;
  local_50 = &local_109;
  pbStack_f0 = args;
  local_58 = args;
  local_48 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>(args);
  local_108 = local_48.data_;
  local_100 = local_48.size_;
  local_18.data_ = local_48.data_;
  local_18.size_ = local_48.size_;
  local_20 = local_e8;
  local_e8[0] = basic_string_view<char>::data(&local_18);
  sVar2 = basic_string_view<char>::size(&local_18);
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = local_a8[0];
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = sVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = local_e8[0];
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = sVar2;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}